

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O1

void __thiscall wasm::MultiMemoryLowering::createMemoryGrowFunctions(MultiMemoryLowering *this)

{
  pointer *ppNVar1;
  iterator __position;
  char *pcVar2;
  pointer puVar3;
  ulong uVar4;
  Name memoryName;
  Name *local_30;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> function;
  
  puVar3 = (this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->wasm->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
    uVar4 = 0;
    do {
      memoryName.super_IString.str._M_str =
           *(char **)&((puVar3[uVar4]._M_t.
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->super_Importable
                      ).super_Named;
      memoryName.super_IString.str._M_len = uVar4;
      memoryGrow((MultiMemoryLowering *)&stack0xffffffffffffffd0,(Index)this,memoryName);
      __position._M_current =
           (this->memoryGrowNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->memoryGrowNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                  ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->memoryGrowNames,
                   __position,local_30);
      }
      else {
        pcVar2 = (local_30->super_IString).str._M_str;
        ((__position._M_current)->super_IString).str._M_len = (local_30->super_IString).str._M_len;
        ((__position._M_current)->super_IString).str._M_str = pcVar2;
        ppNVar1 = &(this->memoryGrowNames).
                   super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppNVar1 = *ppNVar1 + 1;
      }
      Module::addFunction(this->wasm,
                          (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                          &stack0xffffffffffffffd0);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                 &stack0xffffffffffffffd0);
      uVar4 = (ulong)((int)uVar4 + 1);
      puVar3 = (this->wasm->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->wasm->memories).
                                   super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3));
  }
  return;
}

Assistant:

void createMemoryGrowFunctions() {
    for (Index i = 0; i < wasm->memories.size(); i++) {
      auto function = memoryGrow(i, wasm->memories[i]->name);
      memoryGrowNames.push_back(function->name);
      wasm->addFunction(std::move(function));
    }
  }